

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eng_ctrl.c
# Opt level: O0

int int_ctrl_cmd_by_num(ENGINE_CMD_DEFN *defn,uint num)

{
  int iVar1;
  uint in_ESI;
  ENGINE_CMD_DEFN *in_RDI;
  bool bVar2;
  int idx;
  int local_18;
  ENGINE_CMD_DEFN *local_10;
  int local_4;
  
  local_18 = 0;
  local_10 = in_RDI;
  while( true ) {
    iVar1 = int_ctrl_cmd_is_null(local_10);
    bVar2 = false;
    if (iVar1 == 0) {
      bVar2 = local_10->cmd_num < in_ESI;
    }
    if (!bVar2) break;
    local_18 = local_18 + 1;
    local_10 = local_10 + 1;
  }
  if (local_10->cmd_num == in_ESI) {
    local_4 = local_18;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int int_ctrl_cmd_by_num(const ENGINE_CMD_DEFN *defn, unsigned int num)
{
    int idx = 0;
    /*
     * NB: It is stipulated that 'cmd_defn' lists are ordered by cmd_num. So
     * our searches don't need to take any longer than necessary.
     */
    while (!int_ctrl_cmd_is_null(defn) && (defn->cmd_num < num)) {
        idx++;
        defn++;
    }
    if (defn->cmd_num == num)
        return idx;
    /* The given cmd_num wasn't found */
    return -1;
}